

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O3

void __thiscall
CaDiCaL::Internal::connect_proof_tracer
          (Internal *this,FileTracer *tracer,bool antecedents,bool finalize_clauses)

{
  pointer *pppFVar1;
  iterator __position;
  socklen_t __len;
  undefined7 in_register_00000011;
  sockaddr *__addr;
  long lVar3;
  FileTracer *local_30;
  value_type_conflict5 local_28;
  long lVar2;
  
  local_30 = tracer;
  new_proof_on_demand(this);
  if ((((int)CONCAT71(in_register_00000011,antecedents) != 0) && (this->lrat == false)) &&
     (this->lratbuilder == (LratBuilder *)0x0)) {
    this->lrat = true;
  }
  if (finalize_clauses) {
    this->frat = true;
  }
  lVar2 = this->vsize * 2;
  lVar3 = (long)this->max_var + 1;
  if (this->vsize != 0) {
    lVar3 = lVar2;
  }
  local_28 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->unit_clauses_idx,lVar3 * 2,&local_28);
  __len = (socklen_t)lVar2;
  (*(tracer->super_InternalTracer).super_Tracer._vptr_Tracer[0x12])(tracer,this);
  Proof::connect(this->proof,(int)tracer,__addr,__len);
  __position._M_current =
       (this->file_tracers).
       super__Vector_base<CaDiCaL::FileTracer_*,_std::allocator<CaDiCaL::FileTracer_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->file_tracers).
      super__Vector_base<CaDiCaL::FileTracer_*,_std::allocator<CaDiCaL::FileTracer_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<CaDiCaL::FileTracer*,std::allocator<CaDiCaL::FileTracer*>>::
    _M_realloc_insert<CaDiCaL::FileTracer*const&>
              ((vector<CaDiCaL::FileTracer*,std::allocator<CaDiCaL::FileTracer*>> *)
               &this->file_tracers,__position,&local_30);
  }
  else {
    *__position._M_current = tracer;
    pppFVar1 = &(this->file_tracers).
                super__Vector_base<CaDiCaL::FileTracer_*,_std::allocator<CaDiCaL::FileTracer_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  return;
}

Assistant:

void Internal::connect_proof_tracer (FileTracer *tracer, bool antecedents,
                                     bool finalize_clauses) {
  new_proof_on_demand ();
  if (antecedents)
    force_lrat ();
  if (finalize_clauses)
    frat = true;
  resize_unit_clauses_idx ();
  tracer->connect_internal (this);
  proof->connect (tracer);
  file_tracers.push_back (tracer);
}